

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O1

int conn_connect(conn_handle *conn,char *addr,char *port)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  char *__service;
  addrinfo *res;
  addrinfo *res_remote;
  addrinfo *local_68;
  addrinfo *local_60;
  addrinfo local_58;
  
  piVar3 = (int *)conn->priv;
  local_68 = (addrinfo *)0x0;
  local_60 = (addrinfo *)0x0;
  if (conn->type != CONN_TYPE_TCP) {
    return -0x5b;
  }
  local_58.ai_canonname = (char *)0x0;
  local_58.ai_next = (addrinfo *)0x0;
  local_58.ai_addrlen = 0;
  local_58._20_4_ = 0;
  local_58.ai_addr = (sockaddr *)0x0;
  local_58.ai_flags = 1;
  local_58.ai_family = 2;
  local_58.ai_socktype = 1;
  local_58.ai_protocol = 0;
  __service = "0";
  if (conn->source_port != (char *)0x0) {
    __service = conn->source_port;
  }
  iVar1 = getaddrinfo(conn->source_addr,__service,&local_58,&local_68);
  iVar2 = -99;
  if (iVar1 == 0) {
    local_58.ai_flags = 0;
    local_58.ai_family = 0;
    local_58.ai_canonname = (char *)0x0;
    local_58.ai_next = (addrinfo *)0x0;
    local_58.ai_addrlen = 0;
    local_58._20_4_ = 0;
    local_58.ai_addr = (sockaddr *)0x0;
    local_58.ai_socktype = 1;
    local_58.ai_protocol = 0;
    iVar1 = getaddrinfo(addr,port,&local_58,&local_60);
    if (iVar1 == 0) {
      iVar2 = socket(local_68->ai_family,local_68->ai_socktype,local_68->ai_protocol);
      *piVar3 = iVar2;
      if ((iVar2 == -1) || (iVar2 = setsockopt(iVar2,1,2,&conn_connect::yes,4), iVar2 == -1)) {
        piVar3 = __errno_location();
        iVar2 = -*piVar3;
      }
      else {
        iVar2 = bind(*piVar3,local_68->ai_addr,local_68->ai_addrlen);
        if ((iVar2 != -1) &&
           (iVar2 = connect(*piVar3,local_60->ai_addr,local_60->ai_addrlen), iVar2 != -1)) {
          freeaddrinfo(local_60);
          freeaddrinfo(local_68);
          mutex_lock((mutex_handle *)(piVar3 + 0x24));
          piVar3[2] = *piVar3;
          mutex_unlock((mutex_handle *)(piVar3 + 0x24));
          return 0;
        }
        piVar4 = __errno_location();
        iVar2 = -*piVar4;
        shutdown(*piVar3,2);
        close(*piVar3);
        *piVar3 = -1;
      }
    }
  }
  if (local_60 != (addrinfo *)0x0) {
    freeaddrinfo(local_60);
  }
  if (local_68 != (addrinfo *)0x0) {
    freeaddrinfo(local_68);
  }
  return iVar2;
}

Assistant:

int conn_connect(struct conn_handle *conn, const char *addr,
		 const char *port)
{
	struct conn_priv *priv = conn->priv;
	struct addrinfo hints;
	struct addrinfo *res = NULL;
	struct addrinfo *res_remote = NULL;
	static const int yes = 1;
	int ret;

	if (conn->type != CONN_TYPE_TCP)
		return -EPROTOTYPE;

	memset(&hints, 0x0, sizeof(hints));

	hints.ai_family = AF_INET;
	hints.ai_flags = AI_PASSIVE;
	hints.ai_socktype = SOCK_STREAM;

	ret = getaddrinfo(conn->source_addr, conn->source_port == NULL ? "0" :
			  conn->source_port, &hints, &res);
	if (ret != 0) {
		ret = -EADDRNOTAVAIL;
		goto conn_connect_free_early;
	}

	memset(&hints, 0x0, sizeof(hints));

	hints.ai_family = AF_UNSPEC;
	hints.ai_socktype = SOCK_STREAM;

	ret = getaddrinfo(addr, port, &hints, &res_remote);
	if (ret != 0) {
		ret = -EADDRNOTAVAIL;
		goto conn_connect_free_early;
	}

	priv->sock_fd = socket(res->ai_family, res->ai_socktype,
			       res->ai_protocol);
	if (priv->sock_fd == INVALID_SOCKET) {
		ret = SOCK_ERRNO;
		goto conn_connect_free_early;
	}

	ret = setsockopt(priv->sock_fd, SOL_SOCKET, SO_REUSEADDR,
			 (const void *)&yes, sizeof(yes));
	if (ret == SOCKET_ERROR) {
		ret = SOCK_ERRNO;
		goto conn_connect_free_early;
	}

#ifdef __APPLE__
	ret = setsockopt(priv->sock_fd, SOL_SOCKET, SO_NOSIGPIPE,
			 (const void *)&yes, sizeof(yes));
	if (ret == SOCKET_ERROR) {
		ret = SOCK_ERRNO;
		goto conn_connect_free_early;
	}
#endif

	ret = bind(priv->sock_fd, res->ai_addr, (socklen_t)res->ai_addrlen);
	if (ret == SOCKET_ERROR) {
		ret = SOCK_ERRNO;
		goto conn_connect_free;
	}

	ret = connect(priv->sock_fd, res_remote->ai_addr,
		      (socklen_t)res_remote->ai_addrlen);
	if (ret == SOCKET_ERROR) {
		ret = SOCK_ERRNO;
		goto conn_connect_free;
	}

	freeaddrinfo(res_remote);
	freeaddrinfo(res);

	mutex_lock(&priv->mutex);

	priv->fd = priv->sock_fd;

	mutex_unlock(&priv->mutex);

	return 0;

conn_connect_free:
	shutdown(priv->sock_fd, SHUT_RDWR);

	closesocket(priv->sock_fd);

	priv->sock_fd = INVALID_SOCKET;

conn_connect_free_early:
	if (res_remote != NULL)
		freeaddrinfo(res_remote);

	if (res != NULL)
		freeaddrinfo(res);

	return ret;
}